

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  bool bVar1;
  bool bVar2;
  ZeroCopyInputStream *pZVar3;
  int *piVar4;
  pointer old_prefix;
  string *psVar5;
  string temp_disk_file;
  ZeroCopyInputStream *local_b0;
  string local_a8;
  string *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)virtual_file);
  CanonicalizePath(&local_a8,&local_70);
  bVar1 = std::operator!=(virtual_file,&local_a8);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar1 = ContainsParentReference(virtual_file);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar1) {
      old_prefix = (this->mappings_).
                   super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_88 = (string *)&this->last_error_message_;
      local_80 = disk_file;
      while (psVar5 = local_88, old_prefix != local_78) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_local_buf[0] = '\0';
        bVar2 = ApplyMapping(virtual_file,&old_prefix->virtual_path,&old_prefix->disk_path,&local_a8
                            );
        bVar1 = true;
        if (bVar2) {
          pZVar3 = OpenDiskFile(this,&local_a8);
          if (pZVar3 == (ZeroCopyInputStream *)0x0) {
            piVar4 = __errno_location();
            if (*piVar4 == 0xd) {
              std::operator+(&local_50,"Read access is denied for file: ",&local_a8);
              std::__cxx11::string::operator=(local_88,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              bVar1 = false;
              local_b0 = (ZeroCopyInputStream *)0x0;
            }
          }
          else {
            if (local_80 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_80);
            }
            bVar1 = false;
            local_b0 = pZVar3;
          }
        }
        std::__cxx11::string::~string((string *)&local_a8);
        old_prefix = old_prefix + 1;
        if (!bVar1) {
          return local_b0;
        }
      }
      goto LAB_0034d100;
    }
  }
  psVar5 = (string *)&this->last_error_message_;
LAB_0034d100:
  std::__cxx11::string::assign((char *)psVar5);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const std::string& virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return NULL;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            "Read access is denied for file: " + temp_disk_file;
        return NULL;
      }
    }
  }
  last_error_message_ = "File not found.";
  return NULL;
}